

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cc
# Opt level: O2

Token __thiscall Lexer::ReadToken(Lexer *this)

{
  bool bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  Token TVar5;
  byte *pbVar6;
  byte bVar7;
  
  pbVar6 = (byte *)this->ofs_;
LAB_00119e50:
  bVar7 = *pbVar6;
  if (bVar7 == 0x20) goto code_r0x00119e58;
  pbVar4 = pbVar6;
  if (bVar7 < 0x5f) {
    if (bVar7 < 0x2d) {
      if (bVar7 < 0xd) {
        pbVar3 = pbVar6;
        if (bVar7 == 0) {
          TVar5 = TEOF;
        }
        else {
          if (bVar7 != 10) goto LAB_0011a19e;
          TVar5 = NEWLINE;
        }
        goto LAB_0011a05c;
      }
      if (bVar7 != 0x23) {
        if ((bVar7 != 0xd) || (pbVar3 = pbVar6 + 1, pbVar6[1] != 10)) goto LAB_0011a19e;
        goto LAB_00119f1c;
      }
      pbVar4 = pbVar6 + 1;
      bVar7 = pbVar6[1];
      if (bVar7 == 0) goto LAB_0011a19e;
      bVar1 = true;
      pbVar2 = pbVar4;
      while (bVar7 != 10) {
        if (bVar7 == 0) {
          TVar5 = INDENT;
          if (bVar1) {
            TVar5 = ERROR;
          }
          goto LAB_0011a265;
        }
LAB_00119eba:
        bVar7 = pbVar2[1];
        pbVar2 = pbVar2 + 1;
      }
      pbVar6 = pbVar2 + 1;
      goto LAB_00119e50;
    }
    if (bVar7 < 0x3b) {
      if (bVar7 != 0x2f) {
        if (bVar7 != 0x3a) goto LAB_0011a24c;
        pbVar4 = pbVar6 + 1;
        TVar5 = COLON;
        goto LAB_0011a265;
      }
    }
    else {
      if (0x3d < bVar7) {
        if (0x19 < (byte)(bVar7 + 0xbf)) goto LAB_0011a19e;
        goto LAB_0011a24c;
      }
      if (bVar7 == 0x3d) {
        pbVar4 = pbVar6 + 1;
        TVar5 = EQUALS;
        goto LAB_0011a265;
      }
    }
  }
  else if (bVar7 < 0x6a) {
    if (0x62 < bVar7) {
      if (bVar7 == 100) {
        bVar7 = pbVar6[1];
        if (bVar7 != 0x65) goto LAB_0011a222;
        bVar7 = pbVar6[2];
        if (bVar7 != 0x66) goto LAB_0011a228;
        bVar7 = pbVar6[3];
        if (bVar7 != 0x61) goto LAB_0011a22e;
        bVar7 = pbVar6[4];
        if (bVar7 == 0x75) {
          bVar7 = pbVar6[5];
          if (bVar7 != 0x6c) goto LAB_0011a23a;
          bVar7 = pbVar6[6];
          if (bVar7 != 0x74) goto LAB_0011a240;
          pbVar4 = pbVar6 + 7;
          if ((""[pbVar6[7]] & 0x40) != 0) goto LAB_0011a24c;
          TVar5 = DEFAULT;
          goto LAB_0011a265;
        }
      }
      else {
        if (bVar7 != 0x69) goto LAB_0011a24c;
        bVar7 = pbVar6[1];
        if (bVar7 != 0x6e) {
LAB_0011a222:
          pbVar4 = pbVar6 + 1;
          goto LAB_0011a252;
        }
        bVar7 = pbVar6[2];
        if (bVar7 != 99) {
LAB_0011a228:
          pbVar4 = pbVar6 + 2;
          goto LAB_0011a252;
        }
        bVar7 = pbVar6[3];
        if (bVar7 != 0x6c) goto LAB_0011a22e;
        bVar7 = pbVar6[4];
        if (bVar7 == 0x75) {
          bVar7 = pbVar6[5];
          if (bVar7 != 100) {
LAB_0011a23a:
            pbVar4 = pbVar6 + 5;
            goto LAB_0011a252;
          }
          bVar7 = pbVar6[6];
          if (bVar7 != 0x65) {
LAB_0011a240:
            pbVar4 = pbVar6 + 6;
            goto LAB_0011a252;
          }
          pbVar4 = pbVar6 + 7;
          if ((""[pbVar6[7]] & 0x40) != 0) goto LAB_0011a24c;
          TVar5 = INCLUDE;
          goto LAB_0011a265;
        }
      }
LAB_0011a234:
      pbVar4 = pbVar6 + 4;
      goto LAB_0011a252;
    }
    if (bVar7 != 0x60) {
      if (bVar7 != 0x62) goto LAB_0011a24c;
      bVar7 = pbVar6[1];
      if (bVar7 != 0x75) goto LAB_0011a222;
      bVar7 = pbVar6[2];
      if (bVar7 != 0x69) goto LAB_0011a228;
      bVar7 = pbVar6[3];
      if (bVar7 != 0x6c) goto LAB_0011a22e;
      bVar7 = pbVar6[4];
      if (bVar7 != 100) goto LAB_0011a234;
      pbVar4 = pbVar6 + 5;
      if ((""[pbVar6[5]] & 0x40) != 0) goto LAB_0011a24c;
      TVar5 = BUILD;
      goto LAB_0011a265;
    }
  }
  else {
    if (bVar7 < 0x73) {
      if (bVar7 == 0x70) {
        bVar7 = pbVar6[1];
        if (bVar7 != 0x6f) goto LAB_0011a222;
        bVar7 = pbVar6[2];
        if (bVar7 != 0x6f) goto LAB_0011a228;
        bVar7 = pbVar6[3];
        if (bVar7 == 0x6c) {
          pbVar4 = pbVar6 + 4;
          if ((""[pbVar6[4]] & 0x40) != 0) goto LAB_0011a24c;
          TVar5 = POOL;
          goto LAB_0011a265;
        }
      }
      else {
        if (bVar7 != 0x72) goto LAB_0011a24c;
        bVar7 = pbVar6[1];
        if (bVar7 != 0x75) goto LAB_0011a222;
        bVar7 = pbVar6[2];
        if (bVar7 != 0x6c) goto LAB_0011a228;
        bVar7 = pbVar6[3];
        if (bVar7 == 0x65) {
          pbVar4 = pbVar6 + 4;
          if ((""[pbVar6[4]] & 0x40) != 0) goto LAB_0011a24c;
          TVar5 = RULE;
          goto LAB_0011a265;
        }
      }
LAB_0011a22e:
      pbVar4 = pbVar6 + 3;
      goto LAB_0011a252;
    }
    if (bVar7 < 0x7b) {
      if (bVar7 != 0x73) goto LAB_0011a24c;
      bVar7 = pbVar6[1];
      if (bVar7 != 0x75) goto LAB_0011a222;
      bVar7 = pbVar6[2];
      if (bVar7 != 0x62) goto LAB_0011a228;
      bVar7 = pbVar6[3];
      if (bVar7 != 0x6e) goto LAB_0011a22e;
      bVar7 = pbVar6[4];
      if (bVar7 != 0x69) goto LAB_0011a234;
      bVar7 = pbVar6[5];
      if (bVar7 != 0x6e) goto LAB_0011a23a;
      bVar7 = pbVar6[6];
      if (bVar7 != 0x6a) goto LAB_0011a240;
      bVar7 = pbVar6[7];
      if (bVar7 != 0x61) {
        pbVar4 = pbVar6 + 7;
        goto LAB_0011a252;
      }
      pbVar4 = pbVar6 + 8;
      if ((""[pbVar6[8]] & 0x40) == 0) {
        TVar5 = SUBNINJA;
      }
      else {
LAB_0011a24c:
        do {
          bVar7 = pbVar4[1];
          pbVar4 = pbVar4 + 1;
LAB_0011a252:
        } while ((""[bVar7] & 0x40) != 0);
        TVar5 = IDENT;
      }
      goto LAB_0011a265;
    }
    if (bVar7 == 0x7c) {
      pbVar4 = pbVar6 + 1;
      if (pbVar6[1] == 0x7c) {
        pbVar4 = pbVar6 + 2;
      }
      TVar5 = (pbVar6[1] == 0x7c) + PIPE;
      goto LAB_0011a265;
    }
  }
LAB_0011a19e:
  pbVar4 = pbVar6 + 1;
  TVar5 = ERROR;
  goto LAB_0011a265;
code_r0x00119e58:
  pbVar2 = pbVar6 + 1;
  do {
    pbVar4 = pbVar2;
    bVar7 = *pbVar4;
    pbVar2 = pbVar4 + 1;
  } while (bVar7 == 0x20);
  pbVar3 = pbVar4;
  if (0xc < bVar7) {
    if (bVar7 == 0x23) {
      bVar1 = false;
      pbVar2 = pbVar4;
      goto LAB_00119eba;
    }
    if (bVar7 != 0xd) goto LAB_00119f24;
    bVar7 = *pbVar2;
    pbVar3 = pbVar2;
  }
  if (bVar7 == 10) {
LAB_00119f1c:
    TVar5 = NEWLINE;
LAB_0011a05c:
    this->last_token_ = (char *)pbVar6;
    this->ofs_ = (char *)(pbVar3 + 1);
    return TVar5;
  }
LAB_00119f24:
  TVar5 = INDENT;
LAB_0011a265:
  this->last_token_ = (char *)pbVar6;
  this->ofs_ = (char *)pbVar4;
  EatWhitespace(this);
  return TVar5;
}

Assistant:

Lexer::Token Lexer::ReadToken() {
  const char* p = ofs_;
  const char* q;
  const char* start;
  Lexer::Token token;
  for (;;) {
    start = p;
    
{
	unsigned char yych;
	unsigned int yyaccept = 0;
	static const unsigned char yybm[] = {
		  0, 128, 128, 128, 128, 128, 128, 128, 
		128, 128,   0, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		160, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 192, 192, 128, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 128, 128, 128, 128, 128, 128, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 192, 
		128, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 192, 192, 192, 192, 192, 
		192, 192, 192, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
		128, 128, 128, 128, 128, 128, 128, 128, 
	};
	yych = *p;
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '^') {
		if (yych <= ',') {
			if (yych <= '\f') {
				if (yych <= 0x00) goto yy2;
				if (yych == '\n') goto yy6;
				goto yy4;
			} else {
				if (yych <= '\r') goto yy8;
				if (yych == '#') goto yy12;
				goto yy4;
			}
		} else {
			if (yych <= ':') {
				if (yych == '/') goto yy4;
				if (yych <= '9') goto yy13;
				goto yy16;
			} else {
				if (yych <= '=') {
					if (yych <= '<') goto yy4;
					goto yy18;
				} else {
					if (yych <= '@') goto yy4;
					if (yych <= 'Z') goto yy13;
					goto yy4;
				}
			}
		}
	} else {
		if (yych <= 'i') {
			if (yych <= 'b') {
				if (yych == '`') goto yy4;
				if (yych <= 'a') goto yy13;
				goto yy20;
			} else {
				if (yych == 'd') goto yy21;
				if (yych <= 'h') goto yy13;
				goto yy22;
			}
		} else {
			if (yych <= 'r') {
				if (yych == 'p') goto yy23;
				if (yych <= 'q') goto yy13;
				goto yy24;
			} else {
				if (yych <= 'z') {
					if (yych <= 's') goto yy25;
					goto yy13;
				} else {
					if (yych == '|') goto yy26;
					goto yy4;
				}
			}
		}
	}
yy2:
	++p;
	{ token = TEOF;     break; }
yy4:
	++p;
yy5:
	{ token = ERROR;    break; }
yy6:
	++p;
	{ token = NEWLINE;  break; }
yy8:
	yych = *++p;
	if (yych == '\n') goto yy28;
	goto yy5;
yy9:
	yyaccept = 0;
	yych = *(q = ++p);
	if (yybm[0+yych] & 32) {
		goto yy9;
	}
	if (yych <= '\f') {
		if (yych == '\n') goto yy6;
	} else {
		if (yych <= '\r') goto yy30;
		if (yych == '#') goto yy32;
	}
yy11:
	{ token = INDENT;   break; }
yy12:
	yyaccept = 1;
	yych = *(q = ++p);
	if (yych <= 0x00) goto yy5;
	goto yy33;
yy13:
	yych = *++p;
yy14:
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = IDENT;    break; }
yy16:
	++p;
	{ token = COLON;    break; }
yy18:
	++p;
	{ token = EQUALS;   break; }
yy20:
	yych = *++p;
	if (yych == 'u') goto yy36;
	goto yy14;
yy21:
	yych = *++p;
	if (yych == 'e') goto yy37;
	goto yy14;
yy22:
	yych = *++p;
	if (yych == 'n') goto yy38;
	goto yy14;
yy23:
	yych = *++p;
	if (yych == 'o') goto yy39;
	goto yy14;
yy24:
	yych = *++p;
	if (yych == 'u') goto yy40;
	goto yy14;
yy25:
	yych = *++p;
	if (yych == 'u') goto yy41;
	goto yy14;
yy26:
	yych = *++p;
	if (yych == '|') goto yy42;
	{ token = PIPE;     break; }
yy28:
	++p;
	{ token = NEWLINE;  break; }
yy30:
	yych = *++p;
	if (yych == '\n') goto yy28;
yy31:
	p = q;
	if (yyaccept == 0) {
		goto yy11;
	} else {
		goto yy5;
	}
yy32:
	yych = *++p;
yy33:
	if (yybm[0+yych] & 128) {
		goto yy32;
	}
	if (yych <= 0x00) goto yy31;
	++p;
	{ continue; }
yy36:
	yych = *++p;
	if (yych == 'i') goto yy44;
	goto yy14;
yy37:
	yych = *++p;
	if (yych == 'f') goto yy45;
	goto yy14;
yy38:
	yych = *++p;
	if (yych == 'c') goto yy46;
	goto yy14;
yy39:
	yych = *++p;
	if (yych == 'o') goto yy47;
	goto yy14;
yy40:
	yych = *++p;
	if (yych == 'l') goto yy48;
	goto yy14;
yy41:
	yych = *++p;
	if (yych == 'b') goto yy49;
	goto yy14;
yy42:
	++p;
	{ token = PIPE2;    break; }
yy44:
	yych = *++p;
	if (yych == 'l') goto yy50;
	goto yy14;
yy45:
	yych = *++p;
	if (yych == 'a') goto yy51;
	goto yy14;
yy46:
	yych = *++p;
	if (yych == 'l') goto yy52;
	goto yy14;
yy47:
	yych = *++p;
	if (yych == 'l') goto yy53;
	goto yy14;
yy48:
	yych = *++p;
	if (yych == 'e') goto yy55;
	goto yy14;
yy49:
	yych = *++p;
	if (yych == 'n') goto yy57;
	goto yy14;
yy50:
	yych = *++p;
	if (yych == 'd') goto yy58;
	goto yy14;
yy51:
	yych = *++p;
	if (yych == 'u') goto yy60;
	goto yy14;
yy52:
	yych = *++p;
	if (yych == 'u') goto yy61;
	goto yy14;
yy53:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = POOL;     break; }
yy55:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = RULE;     break; }
yy57:
	yych = *++p;
	if (yych == 'i') goto yy62;
	goto yy14;
yy58:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = BUILD;    break; }
yy60:
	yych = *++p;
	if (yych == 'l') goto yy63;
	goto yy14;
yy61:
	yych = *++p;
	if (yych == 'd') goto yy64;
	goto yy14;
yy62:
	yych = *++p;
	if (yych == 'n') goto yy65;
	goto yy14;
yy63:
	yych = *++p;
	if (yych == 't') goto yy66;
	goto yy14;
yy64:
	yych = *++p;
	if (yych == 'e') goto yy68;
	goto yy14;
yy65:
	yych = *++p;
	if (yych == 'j') goto yy70;
	goto yy14;
yy66:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = DEFAULT;  break; }
yy68:
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = INCLUDE;  break; }
yy70:
	yych = *++p;
	if (yych != 'a') goto yy14;
	yych = *++p;
	if (yybm[0+yych] & 64) {
		goto yy13;
	}
	{ token = SUBNINJA; break; }
}

  }

  last_token_ = start;
  ofs_ = p;
  if (token != NEWLINE && token != TEOF)
    EatWhitespace();
  return token;
}